

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixNormalize(Matrix mat)

{
  Matrix *in_RDI;
  float fVar1;
  
  in_RDI->m3 = 0.0;
  in_RDI->m7 = 0.0;
  in_RDI->m11 = 0.0;
  in_RDI->m15 = 0.0;
  in_RDI->m2 = 0.0;
  in_RDI->m6 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m14 = 0.0;
  in_RDI->m1 = 0.0;
  in_RDI->m5 = 0.0;
  in_RDI->m9 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m0 = 0.0;
  in_RDI->m4 = 0.0;
  in_RDI->m8 = 0.0;
  in_RDI->m12 = 0.0;
  fVar1 = mat.m0 * mat.m5 * mat.m10 * mat.m15 +
          (((mat.m1 * mat.m8 * mat.m6 * mat.m15 +
            mat.m4 * mat.m9 * mat.m2 * mat.m15 +
            (((mat.m1 * mat.m4 * mat.m14 * mat.m11 +
              mat.m0 * mat.m13 * mat.m6 * mat.m11 +
              (((mat.m5 * mat.m12 * mat.m2 * mat.m11 +
                mat.m0 * mat.m9 * mat.m14 * mat.m7 +
                (((mat.m10 * mat.m1 * mat.m12 * mat.m7 +
                  mat.m8 * mat.m13 * mat.m2 * mat.m7 +
                  (((mat.m5 * mat.m8 * mat.m14 * mat.m3 +
                    mat.m10 * mat.m4 * mat.m13 * mat.m3 +
                    ((mat.m6 * mat.m9 * mat.m12 * mat.m3 - mat.m6 * mat.m8 * mat.m13 * mat.m3) -
                    mat.m10 * mat.m5 * mat.m12 * mat.m3)) - mat.m14 * mat.m4 * mat.m9 * mat.m3) -
                  mat.m9 * mat.m12 * mat.m2 * mat.m7)) - mat.m10 * mat.m0 * mat.m13 * mat.m7) -
                mat.m14 * mat.m1 * mat.m8 * mat.m7)) - mat.m4 * mat.m13 * mat.m2 * mat.m11) -
              mat.m1 * mat.m12 * mat.m6 * mat.m11)) - mat.m14 * mat.m0 * mat.m5 * mat.m11) -
            mat.m5 * mat.m8 * mat.m2 * mat.m15)) - mat.m0 * mat.m9 * mat.m6 * mat.m15) -
          mat.m1 * mat.m4 * mat.m10 * mat.m15);
  in_RDI->m0 = mat.m0 / fVar1;
  in_RDI->m1 = mat.m1 / fVar1;
  in_RDI->m2 = mat.m2 / fVar1;
  in_RDI->m3 = mat.m3 / fVar1;
  in_RDI->m4 = mat.m4 / fVar1;
  in_RDI->m5 = mat.m5 / fVar1;
  in_RDI->m6 = mat.m6 / fVar1;
  in_RDI->m7 = mat.m7 / fVar1;
  in_RDI->m8 = mat.m8 / fVar1;
  in_RDI->m9 = mat.m9 / fVar1;
  in_RDI->m10 = mat.m10 / fVar1;
  in_RDI->m11 = mat.m11 / fVar1;
  in_RDI->m12 = mat.m12 / fVar1;
  in_RDI->m13 = mat.m13 / fVar1;
  in_RDI->m14 = mat.m14 / fVar1;
  in_RDI->m15 = mat.m15 / fVar1;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixNormalize(Matrix mat)
{
    Matrix result = { 0 };

    float det = MatrixDeterminant(mat);

    result.m0 = mat.m0/det;
    result.m1 = mat.m1/det;
    result.m2 = mat.m2/det;
    result.m3 = mat.m3/det;
    result.m4 = mat.m4/det;
    result.m5 = mat.m5/det;
    result.m6 = mat.m6/det;
    result.m7 = mat.m7/det;
    result.m8 = mat.m8/det;
    result.m9 = mat.m9/det;
    result.m10 = mat.m10/det;
    result.m11 = mat.m11/det;
    result.m12 = mat.m12/det;
    result.m13 = mat.m13/det;
    result.m14 = mat.m14/det;
    result.m15 = mat.m15/det;

    return result;
}